

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Warfare_Header.cpp
# Opt level: O3

KBOOL __thiscall KDIS::PDU::Warfare_Header::operator==(Warfare_Header *this,Warfare_Header *Value)

{
  KBOOL KVar1;
  
  KVar1 = Header7::operator!=(&this->super_Header,&Value->super_Header);
  if ((((!KVar1) &&
       (KVar1 = DATA_TYPE::EntityIdentifier::operator!=
                          (&this->m_FiringEntityID,&Value->m_FiringEntityID), !KVar1)) &&
      (KVar1 = DATA_TYPE::EntityIdentifier::operator!=
                         (&this->m_TargetEntityID,&Value->m_TargetEntityID), !KVar1)) &&
     (KVar1 = DATA_TYPE::EntityIdentifier::operator!=(&this->m_MunitionID,&Value->m_MunitionID),
     !KVar1)) {
    KVar1 = DATA_TYPE::EntityIdentifier::operator!=(&this->m_EventID,&Value->m_EventID);
    return !KVar1;
  }
  return false;
}

Assistant:

KBOOL Warfare_Header::operator == ( const Warfare_Header & Value ) const
{
    if( Header::operator !=( Value ) )               return false;
    if( m_FiringEntityID != Value.m_FiringEntityID ) return false;
    if( m_TargetEntityID != Value.m_TargetEntityID ) return false;
    if( m_MunitionID     != Value.m_MunitionID )     return false;
    if( m_EventID        != Value.m_EventID )        return false;
    return true;
}